

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICharReader.cpp
# Opt level: O2

int ICharReader::readSpecialChar(ifstream *ifs,string *str)

{
  size_type sVar1;
  char cVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  string asStack_48 [32];
  
  std::istream::tellg();
  sVar1 = str->_M_string_length;
  cVar2 = std::istream::get();
  bVar3 = IDictionary::isSimpleTransfer(cVar2);
  cVar4 = (char)str;
  if (bVar3) {
    std::__cxx11::string::push_back(cVar4);
  }
  else if (cVar2 == 'x') {
    std::__cxx11::string::push_back(cVar4);
    for (iVar5 = 0; iVar5 != -3; iVar5 = iVar5 + -1) {
      cVar2 = std::istream::get();
      bVar3 = IDictionary::isNumber16(cVar2);
      if (!bVar3) {
        if (iVar5 == 0) {
          std::__cxx11::string::substr((ulong)asStack_48,(ulong)str);
          std::__cxx11::string::operator=((string *)str,asStack_48);
          std::__cxx11::string::~string(asStack_48);
        }
        break;
      }
      std::__cxx11::string::push_back(cVar4);
    }
  }
  else {
    bVar3 = IDictionary::isNumber8(cVar2);
    if (bVar3) {
      std::__cxx11::string::push_back(cVar4);
      iVar5 = 2;
      while (bVar3 = iVar5 != 0, iVar5 = iVar5 + -1, bVar3) {
        cVar2 = std::istream::get();
        bVar3 = IDictionary::isNumber8(cVar2);
        if (!bVar3) break;
        std::__cxx11::string::push_back(cVar4);
      }
    }
  }
  return (int)str->_M_string_length - (int)sVar1;
}

Assistant:

int ICharReader::readSpecialChar(std::ifstream *ifs,std::string &str) {
    char tempChar;
    int base_pos=ifs->tellg();
    int base_len=str.length();

    tempChar=ifs->get();
    if(IDictionary::isSimpleTransfer(tempChar))
    {
        str+=tempChar;
    }
    else if(tempChar=='x')
    {
        str+=tempChar;
        for(int i=0;i<3;i++)
        {
            tempChar=ifs->get();
            if(IDictionary::isNumber16(tempChar))
            {
                str+=tempChar;
            }
            else
            {
                if(i==0)
                    str=str.substr(0,base_len);
                break;
            }
        }
    }
    else if(IDictionary::isNumber8(tempChar))
    {
        str+=tempChar;
        for(int i=0;i<2;i++)
        {
            tempChar=ifs->get();
            if(IDictionary::isNumber8(tempChar))
            {
                str+=tempChar;
            }
            else
            {
                break;
            }
        }
    }
    return str.length()-base_len;
}